

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::LoadFileSummary(BamToolsIndex *this)

{
  bool bVar1;
  iterator refSummary;
  iterator __lhs;
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  *in_RDI;
  BamToolsIndex *unaff_retaddr;
  iterator summaryEnd;
  iterator summaryIter;
  int numReferences;
  int *in_stack_00000058;
  BamToolsIndex *in_stack_00000060;
  BamToolsIndex *in_stack_fffffffffffffff0;
  vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
  *numReferences_00;
  
  numReferences_00 = in_RDI;
  LoadNumReferences(in_stack_00000060,in_stack_00000058);
  InitializeFileSummary(unaff_retaddr,(int *)numReferences_00);
  refSummary = std::
               vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
               ::begin(in_RDI);
  __lhs = std::
          vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
          ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
    ::operator*((__normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
                 *)&stack0xffffffffffffffe8);
    LoadReferenceSummary(in_stack_fffffffffffffff0,refSummary._M_current);
    __gnu_cxx::
    __normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
    ::operator++((__normal_iterator<BamTools::Internal::BtiReferenceSummary_*,_std::vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>_>
                  *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void BamToolsIndex::LoadFileSummary()
{

    // load number of reference sequences
    int numReferences;
    LoadNumReferences(numReferences);

    // initialize file summary data
    InitializeFileSummary(numReferences);

    // load summary for each reference
    BtiFileSummary::iterator summaryIter = m_indexFileSummary.begin();
    BtiFileSummary::iterator summaryEnd = m_indexFileSummary.end();
    for (; summaryIter != summaryEnd; ++summaryIter) {
        LoadReferenceSummary(*summaryIter);
    }
}